

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaFixupSimpleTypeStageTwo(xmlSchemaParserCtxtPtr pctxt,xmlSchemaTypePtr type)

{
  xmlSchemaTypeType xVar1;
  uint uVar2;
  xmlSchemaParserCtxtPtr ctxt;
  int iVar3;
  xmlSchemaTypePtr pxVar4;
  _xmlSchemaTypeLink *p_Var5;
  xmlChar *pxVar6;
  xmlSchemaTypeLinkPtr pxVar7;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  xmlSchemaTypeLinkPtr pxVar10;
  xmlSchemaFacetPtr pxVar11;
  xmlSchemaTypePtr pxVar12;
  _xmlSchemaTypeLink *p_Var13;
  xmlParserErrors xVar14;
  xmlSchemaParserCtxtPtr pxVar15;
  xmlSchemaFacetPtr in_R8;
  char *pcVar16;
  uint uVar17;
  undefined8 uVar18;
  xmlSchemaTypePtr pxVar19;
  byte bVar20;
  xmlSchemaFacetPtr facet;
  _xmlSchemaTypeLink *p_Var21;
  bool bVar22;
  xmlChar *str;
  xmlChar *strBT;
  xmlChar *strBMT;
  xmlChar *local_68;
  xmlSchemaParserCtxtPtr local_60;
  xmlSchemaTypePtr local_58;
  xmlChar *local_50;
  xmlChar *local_48;
  xmlSchemaTypeLinkPtr local_40;
  int local_34;
  
  uVar17 = 0xffffffff;
  if (type->type != XML_SCHEMA_TYPE_SIMPLE) {
    return -1;
  }
  if (((uint)type->flags >> 0x16 & 1) != 0) {
    return 0;
  }
  local_34 = pctxt->nberrors;
  type->flags = type->flags | 0x400000;
  type->contentType = XML_SCHEMA_CONTENT_SIMPLE;
  pxVar4 = type->baseType;
  if (pxVar4 == (xmlSchemaTypePtr)0x0) {
    xmlSchemaInternalErr2
              ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaFixupSimpleTypeStageTwo","missing baseType"
               ,(xmlChar *)0x0,(xmlChar *)in_R8);
    return -1;
  }
  if ((pxVar4->type != XML_SCHEMA_TYPE_BASIC) && ((pxVar4->flags & 0x400000) == 0)) {
    xmlSchemaTypeFixup(pxVar4,(xmlSchemaAbstractCtxtPtr)pctxt);
  }
  local_40 = (xmlSchemaTypeLinkPtr)&type->memberTypes;
  local_60 = pctxt;
  local_58 = type;
  if (type->memberTypes != (xmlSchemaTypeLinkPtr)0x0) {
    pxVar7 = *(xmlSchemaTypeLinkPtr *)local_40;
    bVar22 = pxVar7 == (xmlSchemaTypeLinkPtr)0x0;
    uVar18 = CONCAT71(0xffffff,bVar22);
    uVar17 = (uint)uVar18;
    while (!bVar22) {
      uVar17 = (uint)uVar18;
      pxVar4 = pxVar7->type;
      if ((pxVar4->type != XML_SCHEMA_TYPE_BASIC) && ((pxVar4->flags & 0x400000) == 0)) {
        xmlSchemaTypeFixup(pxVar4,(xmlSchemaAbstractCtxtPtr)local_60);
      }
      pxVar4 = pxVar7->type;
      if ((pxVar4->flags & 0x80) != 0) {
        for (; (pxVar4 != (xmlSchemaTypePtr)0x0 && (pxVar4->type == XML_SCHEMA_TYPE_SIMPLE));
            pxVar4 = pxVar4->baseType) {
          pxVar10 = pxVar4->memberTypes;
          if (pxVar10 != (xmlSchemaTypeLinkPtr)0x0) goto LAB_001bd146;
        }
        pxVar10 = (xmlSchemaTypeLinkPtr)0x0;
LAB_001bd146:
        if (pxVar10 != (xmlSchemaTypeLinkPtr)0x0) {
          pxVar7->type = pxVar10->type;
          p_Var13 = pxVar10->next;
          if (p_Var13 != (_xmlSchemaTypeLink *)0x0) {
            p_Var21 = pxVar7->next;
            pxVar10 = pxVar7;
            do {
              p_Var5 = (_xmlSchemaTypeLink *)(*xmlMalloc)(0x10);
              if (p_Var5 == (_xmlSchemaTypeLink *)0x0) {
                if (local_60 != (xmlSchemaParserCtxtPtr)0x0) {
                  local_60->nberrors = local_60->nberrors + 1;
                }
                in_R8 = (xmlSchemaFacetPtr)0x1fd882;
                __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"allocating a type link");
                if ((char)uVar18 == '\0') {
                  return -1;
                }
                goto LAB_001bd1f0;
              }
              p_Var5->type = p_Var13->type;
              pxVar10->next = p_Var5;
              p_Var5->next = p_Var21;
              p_Var13 = p_Var13->next;
              pxVar10 = p_Var5;
            } while (p_Var13 != (_xmlSchemaTypeLink *)0x0);
          }
        }
      }
      pxVar7 = pxVar7->next;
      bVar22 = pxVar7 == (_xmlSchemaTypeLink *)0x0;
      uVar18 = CONCAT71((int7)((ulong)uVar18 >> 8),bVar22);
      uVar17 = (uint)uVar18;
    }
  }
LAB_001bd1f0:
  pxVar12 = local_58;
  pxVar15 = local_60;
  pxVar4 = local_58->baseType;
  local_68 = (xmlChar *)0x0;
  if (pxVar4 == (xmlSchemaTypePtr)0x0) {
    pcVar16 = "No base type existent";
LAB_001bd288:
    xmlSchemaPCustomErrExt
              (local_60,XML_SCHEMAP_ST_PROPS_CORRECT_1,(xmlSchemaBasicItemPtr)local_58,
               (xmlNodePtr)0x0,pcVar16,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
    goto LAB_001bd29d;
  }
  xVar1 = pxVar4->type;
  if ((xVar1 == XML_SCHEMA_TYPE_SIMPLE) ||
     ((xVar1 == XML_SCHEMA_TYPE_BASIC && (pxVar4->builtInType != 0x2d)))) {
    uVar2 = local_58->flags;
    if (((char)((uVar2 & 4) >> 2) == '\0' && (uVar2 & 0xc0) != 0) &&
       ((xVar1 != XML_SCHEMA_TYPE_SIMPLE &&
        ((xVar1 != XML_SCHEMA_TYPE_BASIC || (pxVar4->builtInType != 0x2e)))))) {
      pxVar6 = xmlSchemaGetComponentQName(&local_68,pxVar4);
      pcVar16 = 
      "A type, derived by list or union, must have the simple ur-type definition as base type, not \'%s\'"
      ;
      goto LAB_001bd244;
    }
    if ((uVar2 & 0x1c0) == 0) {
      pcVar16 = "The variety is absent";
      goto LAB_001bd288;
    }
    if ((pxVar4->flags & 0x400) == 0) {
      local_68 = (xmlChar *)0x0;
      if (local_58->type != XML_SCHEMA_TYPE_SIMPLE) {
        xmlSchemaInternalErr2
                  ((xmlSchemaAbstractCtxtPtr)local_60,"xmlSchemaCheckCOSSTRestricts",
                   "given type is not a user-derived simpleType",(xmlChar *)0x0,(xmlChar *)in_R8);
        uVar17 = 0xffffffff;
        goto LAB_001bd5a3;
      }
      uVar2 = local_58->flags;
      if ((uVar2 >> 8 & 1) == 0) {
        if ((uVar2 & 0x40) != 0) {
          pxVar4 = local_58->subtypes;
          if (pxVar4 == (xmlSchemaTypePtr)0x0) {
LAB_001bd492:
            bVar20 = 0;
            xmlSchemaInternalErr2
                      ((xmlSchemaAbstractCtxtPtr)local_60,"xmlSchemaCheckCOSSTRestricts",
                       "failed to evaluate the item type",(xmlChar *)0x0,(xmlChar *)in_R8);
            uVar17 = 0xffffffff;
            goto LAB_001bdc9e;
          }
          if (pxVar4->type == XML_SCHEMA_TYPE_SIMPLE) {
            if ((pxVar4->flags & 0x400000) == 0) {
              xmlSchemaTypeFixup(pxVar4,(xmlSchemaAbstractCtxtPtr)local_60);
            }
          }
          else if ((pxVar4->type != XML_SCHEMA_TYPE_BASIC) || (pxVar4->builtInType == 0x2d))
          goto LAB_001bd492;
          if ((pxVar4->flags & 0x180U) == 0) {
            pxVar6 = xmlSchemaGetComponentQName(&local_68,pxVar4);
            pcVar16 = "The item type \'%s\' does not have a variety of atomic or union";
            uVar17 = 0xbc7;
            xVar14 = XML_SCHEMAP_COS_ST_RESTRICTS_2_1;
            goto LAB_001bd7d6;
          }
          if ((char)pxVar4->flags < '\0') {
            pxVar7 = (xmlSchemaTypeLinkPtr)&pxVar4->memberTypes;
            do {
              pxVar7 = pxVar7->next;
              if (pxVar7 == (xmlSchemaTypeLinkPtr)0x0) goto LAB_001bd724;
            } while ((pxVar7->type->flags & 0x100) != 0);
            pxVar6 = xmlSchemaGetComponentQName(&local_68,pxVar7->type);
            pcVar16 = 
            "The item type is a union type, but the member type \'%s\' of this item type is not atomic"
            ;
            uVar17 = 0xbc7;
            xVar14 = XML_SCHEMAP_COS_ST_RESTRICTS_2_1;
LAB_001bda12:
            bVar20 = 0;
            xmlSchemaPCustomErrExt
                      (pxVar15,xVar14,(xmlSchemaBasicItemPtr)pxVar12,(xmlNodePtr)0x0,pcVar16,pxVar6,
                       (xmlChar *)0x0,(xmlChar *)0x0);
            pxVar12 = local_58;
            pxVar15 = local_60;
            if (local_68 == (xmlChar *)0x0) goto LAB_001bdc9e;
            (*xmlFree)(local_68);
            local_68 = (xmlChar *)0x0;
          }
          else {
LAB_001bd724:
            pxVar19 = pxVar12->baseType;
            if ((pxVar19->type == XML_SCHEMA_TYPE_BASIC) && (pxVar19->builtInType == 0x2e)) {
              if ((pxVar4->flags & 0x800) == 0) {
                uVar17 = 0xbc7;
                bVar22 = true;
                for (pxVar11 = local_58->facets; pxVar11 != (xmlSchemaFacetPtr)0x0;
                    pxVar11 = pxVar11->next) {
                  if (pxVar11->type != XML_SCHEMA_FACET_WHITESPACE) {
                    uVar17 = 0xbc9;
                    xmlSchemaPIllegalFacetListUnionErr
                              (local_60,XML_SCHEMAP_COS_ST_RESTRICTS_2_3_1_2,local_58,pxVar11);
                    goto LAB_001bdc85;
                  }
                }
              }
              else {
                pxVar6 = xmlSchemaGetComponentQName(&local_68,pxVar4);
                bVar22 = false;
                uVar17 = 0xbc8;
                xmlSchemaPCustomErrExt
                          (local_60,XML_SCHEMAP_COS_ST_RESTRICTS_2_3_1_1,
                           (xmlSchemaBasicItemPtr)local_58,(xmlNodePtr)0x0,
                           "The final of its item type \'%s\' must not contain \'list\'",pxVar6,
                           (xmlChar *)0x0,(xmlChar *)0x0);
                if (local_68 != (xmlChar *)0x0) {
                  (*xmlFree)(local_68);
                  local_68 = (xmlChar *)0x0;
LAB_001bdc85:
                  bVar22 = false;
                }
              }
              if (bVar22) goto LAB_001bdc91;
            }
            else {
              if ((pxVar19->flags & 0x40U) == 0) {
                pxVar6 = xmlSchemaGetComponentQName(&local_68,pxVar19);
                pcVar16 = "The base type \'%s\' must be a list type";
                uVar17 = 0xbca;
                xVar14 = XML_SCHEMAP_COS_ST_RESTRICTS_2_3_2_1;
                goto LAB_001bd7d6;
              }
              if (((uint)pxVar19->flags >> 10 & 1) != 0) {
                pxVar6 = xmlSchemaGetComponentQName(&local_68,pxVar19);
                pcVar16 = "The \'final\' of the base type \'%s\' must not contain \'restriction\'";
                uVar17 = 0xbcb;
                xVar14 = XML_SCHEMAP_COS_ST_RESTRICTS_2_3_2_2;
                pxVar12 = local_58;
                pxVar15 = local_60;
                goto LAB_001bda12;
              }
              pxVar12 = pxVar19->subtypes;
              if ((pxVar12 == (xmlSchemaTypePtr)0x0) ||
                 ((pxVar12->type != XML_SCHEMA_TYPE_SIMPLE &&
                  ((pxVar12->type != XML_SCHEMA_TYPE_BASIC || (pxVar12->builtInType == 0x2d)))))) {
                bVar22 = false;
                xmlSchemaInternalErr2
                          ((xmlSchemaAbstractCtxtPtr)local_60,"xmlSchemaCheckCOSSTRestricts",
                           "failed to eval the item type of a base type",(xmlChar *)0x0,
                           (xmlChar *)in_R8);
                uVar17 = 0xffffffff;
              }
              else {
                uVar17 = 0xbc7;
                bVar22 = true;
                if ((pxVar4 != pxVar12) &&
                   (iVar3 = xmlSchemaCheckCOSSTDerivedOK
                                      ((xmlSchemaAbstractCtxtPtr)local_60,pxVar4,pxVar12,0),
                   iVar3 != 0)) {
                  local_48 = (xmlChar *)0x0;
                  local_50 = (xmlChar *)0x0;
                  pxVar6 = xmlSchemaGetComponentQName(&local_68,pxVar4);
                  pxVar8 = xmlSchemaGetComponentQName(&local_48,pxVar12);
                  pxVar4 = local_58;
                  pxVar9 = xmlSchemaGetComponentQName(&local_50,local_58->baseType);
                  xmlSchemaPCustomErrExt
                            (local_60,XML_SCHEMAP_COS_ST_RESTRICTS_2_3_2_3,
                             (xmlSchemaBasicItemPtr)pxVar4,(xmlNodePtr)0x0,
                             "The item type \'%s\' is not validly derived from the item type \'%s\' of the base type \'%s\'"
                             ,pxVar6,pxVar8,pxVar9);
                  if (local_68 != (xmlChar *)0x0) {
                    (*xmlFree)(local_68);
                    local_68 = (xmlChar *)0x0;
                  }
                  if (local_48 != (xmlChar *)0x0) {
                    (*xmlFree)(local_48);
                    local_48 = (xmlChar *)0x0;
                  }
                  if (local_50 != (xmlChar *)0x0) {
                    (*xmlFree)(local_50);
                    local_50 = (xmlChar *)0x0;
                  }
                  uVar17 = 0xbcc;
                  bVar22 = false;
                }
              }
              pxVar4 = local_58;
              pxVar15 = local_60;
              if (bVar22) {
                pxVar11 = local_58->facets;
                if (pxVar11 != (xmlSchemaFacetPtr)0x0) {
                  bVar22 = true;
                  do {
                    if (5 < pxVar11->type - XML_SCHEMA_FACET_PATTERN) {
                      xmlSchemaPIllegalFacetListUnionErr
                                (pxVar15,XML_SCHEMAP_COS_ST_RESTRICTS_2_3_2_4,pxVar4,pxVar11);
                      bVar22 = false;
                    }
                    pxVar11 = pxVar11->next;
                  } while (pxVar11 != (_xmlSchemaFacet *)0x0);
                  if (!bVar22) {
                    uVar17 = 0xbcd;
                    goto LAB_001bda3a;
                  }
                }
LAB_001bdc91:
                bVar20 = 1;
                pxVar12 = local_58;
                pxVar15 = local_60;
                goto LAB_001bdc9e;
              }
            }
          }
LAB_001bda3a:
          bVar20 = 0;
          pxVar12 = local_58;
          pxVar15 = local_60;
          goto LAB_001bdc9e;
        }
        p_Var13 = local_40;
        if ((char)uVar2 < '\0') {
          do {
            ctxt = local_60;
            p_Var13 = p_Var13->next;
            if (p_Var13 == (_xmlSchemaTypeLink *)0x0) {
              pxVar4 = pxVar12->baseType;
              pxVar7 = local_40;
              if (pxVar4->builtInType == 0x2e) goto LAB_001bd644;
              if (-1 < (char)pxVar4->flags) {
                pxVar6 = xmlSchemaGetComponentQName(&local_68,pxVar4);
                pcVar16 = "The base type \'%s\' is not a union type";
                uVar17 = 0xbd3;
                xVar14 = XML_SCHEMAP_COS_ST_RESTRICTS_3_3_2_1;
                goto LAB_001bd7d6;
              }
              if (((uint)pxVar4->flags >> 10 & 1) == 0 || pxVar4 == (xmlSchemaTypePtr)0x0) {
                p_Var13 = local_40->next;
                if (p_Var13 != (_xmlSchemaTypeLink *)0x0) goto LAB_001bd8bf;
                goto LAB_001bdb06;
              }
              pxVar6 = xmlSchemaGetComponentQName(&local_68,pxVar4);
              pcVar16 = "The \'final\' of its base type \'%s\' must not contain \'restriction\'";
              uVar17 = 0xbd2;
              xVar14 = XML_SCHEMAP_COS_ST_RESTRICTS_3_3_2_2;
              pxVar12 = local_58;
              goto LAB_001bda12;
            }
            pxVar4 = p_Var13->type;
            if ((pxVar4->type != XML_SCHEMA_TYPE_BASIC) && ((pxVar4->flags & 0x400000) == 0)) {
              xmlSchemaTypeFixup(pxVar4,(xmlSchemaAbstractCtxtPtr)pxVar15);
            }
          } while ((p_Var13->type->flags & 0x140) != 0);
          pxVar6 = xmlSchemaGetComponentQName(&local_68,p_Var13->type);
          pcVar16 = "The member type \'%s\' is neither an atomic, nor a list type";
          uVar17 = 0xbcf;
          xVar14 = XML_SCHEMAP_COS_ST_RESTRICTS_3_1;
LAB_001bd7d6:
          bVar20 = 0;
          xmlSchemaPCustomErrExt
                    (pxVar15,xVar14,(xmlSchemaBasicItemPtr)pxVar12,(xmlNodePtr)0x0,pcVar16,pxVar6,
                     (xmlChar *)0x0,(xmlChar *)0x0);
          if (local_68 != (xmlChar *)0x0) {
            (*xmlFree)(local_68);
            local_68 = (xmlChar *)0x0;
            bVar20 = 0;
          }
          goto LAB_001bdc9e;
        }
        goto LAB_001bd5a0;
      }
      pxVar4 = local_58->baseType;
      if (((uint)pxVar4->flags >> 8 & 1) == 0) {
        pxVar6 = xmlSchemaGetComponentQName(&local_68,pxVar4);
        pcVar16 = "The base type \'%s\' is not an atomic simple type";
        uVar17 = 0xbc3;
        xVar14 = XML_SCHEMAP_COS_ST_RESTRICTS_1_1;
LAB_001bd571:
        bVar22 = false;
        xmlSchemaPCustomErrExt
                  (pxVar15,xVar14,(xmlSchemaBasicItemPtr)pxVar12,(xmlNodePtr)0x0,pcVar16,pxVar6,
                   (xmlChar *)0x0,(xmlChar *)0x0);
        if (local_68 != (xmlChar *)0x0) {
          (*xmlFree)(local_68);
          local_68 = (xmlChar *)0x0;
          bVar22 = false;
        }
      }
      else {
        if (((uint)pxVar4->flags >> 10 & 1) != 0 && pxVar4 != (xmlSchemaTypePtr)0x0) {
          pxVar6 = xmlSchemaGetComponentQName(&local_68,pxVar4);
          pcVar16 = "The final of its base type \'%s\' must not contain \'restriction\'";
          uVar17 = 0xbc4;
          xVar14 = XML_SCHEMAP_COS_ST_RESTRICTS_1_2;
          goto LAB_001bd571;
        }
        pxVar4 = (xmlSchemaTypePtr)local_58->facets;
        pxVar19 = local_58;
        if (pxVar4 == (xmlSchemaTypePtr)0x0) {
          bVar22 = true;
        }
        else {
          for (; pxVar19 != (xmlSchemaTypePtr)0x0; pxVar19 = pxVar19->baseType) {
            if ((pxVar19->builtInType == 0x2e) || ((pxVar19->flags & 0x4000) != 0))
            goto LAB_001bd4fe;
          }
          pxVar19 = (xmlSchemaTypePtr)0x0;
LAB_001bd4fe:
          if (pxVar19 == (xmlSchemaTypePtr)0x0) {
            bVar22 = false;
            xmlSchemaInternalErr2
                      ((xmlSchemaAbstractCtxtPtr)local_60,"xmlSchemaCheckCOSSTRestricts",
                       "failed to get primitive type",(xmlChar *)0x0,(xmlChar *)in_R8);
            uVar17 = 0xffffffff;
          }
          else {
            bVar22 = true;
            do {
              iVar3 = xmlSchemaIsBuiltInTypeFacet(pxVar19,pxVar4->type);
              if (iVar3 == 0) {
                xmlSchemaPIllegalFacetAtomicErr
                          (pxVar15,(xmlParserErrors)pxVar12,pxVar19,pxVar4,in_R8);
                bVar22 = false;
              }
              pxVar4 = pxVar4->next;
            } while (pxVar4 != (_xmlSchemaType *)0x0);
            uVar17 = 0xbc5;
          }
        }
      }
      if (bVar22) goto LAB_001bd5a0;
      goto LAB_001bd5a3;
    }
    pxVar6 = xmlSchemaGetComponentQName(&local_68,pxVar4);
    pcVar16 = "The \'final\' of its base type \'%s\' must not contain \'restriction\'";
    xVar14 = XML_SCHEMAP_ST_PROPS_CORRECT_3;
  }
  else {
    pxVar6 = xmlSchemaGetComponentQName(&local_68,pxVar4);
    pcVar16 = "The base type \'%s\' is not a simple type";
LAB_001bd244:
    xVar14 = XML_SCHEMAP_ST_PROPS_CORRECT_1;
  }
  xmlSchemaPCustomErrExt
            (pxVar15,xVar14,(xmlSchemaBasicItemPtr)pxVar12,(xmlNodePtr)0x0,pcVar16,pxVar6,
             (xmlChar *)0x0,(xmlChar *)0x0);
  if (local_68 != (xmlChar *)0x0) {
    (*xmlFree)(local_68);
  }
LAB_001bd29d:
  iVar3 = 0;
  if (local_34 != pxVar15->nberrors) {
    iVar3 = pxVar15->err;
  }
  return iVar3;
  while ((pxVar4 = pxVar7->type, pxVar4 == (xmlSchemaTypePtr)0x0 || ((pxVar4->flags & 0x1000) == 0))
        ) {
LAB_001bd644:
    pxVar7 = pxVar7->next;
    if (pxVar7 == (xmlSchemaTypeLinkPtr)0x0) {
      if (pxVar12->facetSet == (xmlSchemaFacetLinkPtr)0x0) {
        bVar20 = 1;
      }
      else {
        bVar20 = 0;
        uVar17 = 0xbd1;
        xmlSchemaPCustomErrExt
                  (pxVar15,XML_SCHEMAP_COS_ST_RESTRICTS_3_3_1_2,(xmlSchemaBasicItemPtr)pxVar12,
                   (xmlNodePtr)0x0,"No facets allowed",(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0)
        ;
      }
      goto LAB_001bdc9e;
    }
  }
  pxVar6 = xmlSchemaGetComponentQName(&local_68,pxVar4);
  pcVar16 = "The \'final\' of member type \'%s\' contains \'union\'";
  uVar17 = 0xbd0;
  xVar14 = XML_SCHEMAP_COS_ST_RESTRICTS_3_3_1;
  goto LAB_001bda12;
LAB_001bd8bf:
  if ((pxVar4 == (xmlSchemaTypePtr)0x0) || (pxVar4->type != XML_SCHEMA_TYPE_SIMPLE))
  goto LAB_001bdaa5;
  p_Var21 = pxVar4->memberTypes;
  if (p_Var21 != (xmlSchemaTypeLinkPtr)0x0) goto LAB_001bdabb;
  pxVar4 = pxVar4->baseType;
  goto LAB_001bd8bf;
LAB_001bdaa5:
  p_Var21 = (xmlSchemaTypeLinkPtr)0x0;
LAB_001bdabb:
  do {
    if (p_Var21 == (xmlSchemaTypeLinkPtr)0x0) {
      xmlSchemaInternalErr2
                ((xmlSchemaAbstractCtxtPtr)ctxt,"xmlSchemaCheckCOSSTRestricts",
                 "different number of member types in base",(xmlChar *)0x0,(xmlChar *)in_R8);
    }
    else if ((p_Var13->type != p_Var21->type) &&
            (iVar3 = xmlSchemaCheckCOSSTDerivedOK
                               ((xmlSchemaAbstractCtxtPtr)ctxt,p_Var13->type,p_Var21->type,0),
            iVar3 != 0)) {
      local_48 = (xmlChar *)0x0;
      local_50 = (xmlChar *)0x0;
      pxVar6 = xmlSchemaGetComponentQName(&local_68,p_Var13->type);
      pxVar8 = xmlSchemaGetComponentQName(&local_48,p_Var21->type);
      pxVar4 = local_58;
      pxVar9 = xmlSchemaGetComponentQName(&local_50,local_58->baseType);
      xmlSchemaPCustomErrExt
                (ctxt,XML_SCHEMAP_COS_ST_RESTRICTS_3_3_2_3,(xmlSchemaBasicItemPtr)pxVar4,
                 (xmlNodePtr)0x0,
                 "The member type %s is not validly derived from its corresponding member type %s of the base type %s"
                 ,pxVar6,pxVar8,pxVar9);
      if (local_68 != (xmlChar *)0x0) {
        (*xmlFree)(local_68);
        local_68 = (xmlChar *)0x0;
      }
      if (local_48 != (xmlChar *)0x0) {
        (*xmlFree)(local_48);
        local_48 = (xmlChar *)0x0;
      }
      if (local_50 != (xmlChar *)0x0) {
        (*xmlFree)(local_50);
        local_50 = (xmlChar *)0x0;
      }
      uVar17 = 0xbd4;
      goto LAB_001bda3a;
    }
    p_Var13 = p_Var13->next;
    if (p_Var21 == (xmlSchemaTypeLinkPtr)0x0) {
      p_Var21 = (_xmlSchemaTypeLink *)0x0;
    }
    else {
      p_Var21 = p_Var21->next;
    }
  } while (p_Var13 != (_xmlSchemaTypeLink *)0x0);
LAB_001bdb06:
  pxVar12 = local_58;
  pxVar15 = local_60;
  pxVar11 = local_58->facets;
  if (pxVar11 == (xmlSchemaFacetPtr)0x0) {
    uVar17 = 0xbd4;
    goto LAB_001bdc91;
  }
  bVar20 = 1;
  do {
    if ((pxVar11->type & ~XML_SCHEMA_TYPE_BASIC) != XML_SCHEMA_FACET_PATTERN) {
      xmlSchemaPIllegalFacetListUnionErr
                (pxVar15,XML_SCHEMAP_COS_ST_RESTRICTS_3_3_2_4,pxVar12,pxVar11);
      bVar20 = 0;
    }
    pxVar11 = pxVar11->next;
  } while (pxVar11 != (_xmlSchemaFacet *)0x0);
  uVar17 = bVar20 ^ 0xbd5;
LAB_001bdc9e:
  if (bVar20 != 0) {
LAB_001bd5a0:
    uVar17 = 0;
  }
LAB_001bd5a3:
  if (uVar17 == 0xffffffff) {
    return -1;
  }
  if (uVar17 == 0) {
    iVar3 = xmlSchemaCheckFacetValues(pxVar12,pxVar15);
    if (iVar3 == -1) {
      return -1;
    }
    if (iVar3 == 0) {
      if (((pxVar12->facetSet != (xmlSchemaFacetLinkPtr)0x0) ||
          (pxVar12->baseType->facetSet != (xmlSchemaFacetLinkPtr)0x0)) &&
         (iVar3 = xmlSchemaDeriveAndValidateFacets(pxVar15,pxVar12), iVar3 == -1)) {
        return -1;
      }
      iVar3 = xmlSchemaTypeFixupWhitespace(pxVar12);
      if (iVar3 == -1) {
        return -1;
      }
      if (iVar3 == 0) {
        xmlSchemaTypeFixupOptimFacets(pxVar12);
      }
    }
  }
  goto LAB_001bd29d;
}

Assistant:

static int
xmlSchemaFixupSimpleTypeStageTwo(xmlSchemaParserCtxtPtr pctxt,
				 xmlSchemaTypePtr type)
{
    int res, olderrs = pctxt->nberrors;

    if (type->type != XML_SCHEMA_TYPE_SIMPLE)
	return(-1);

    if (! WXS_IS_TYPE_NOT_FIXED(type))
	return(0);

    type->flags |= XML_SCHEMAS_TYPE_INTERNAL_RESOLVED;
    type->contentType = XML_SCHEMA_CONTENT_SIMPLE;

    if (type->baseType == NULL) {
	PERROR_INT("xmlSchemaFixupSimpleTypeStageTwo",
	    "missing baseType");
	goto exit_failure;
    }
    if (WXS_IS_TYPE_NOT_FIXED(type->baseType))
	xmlSchemaTypeFixup(type->baseType, ACTXT_CAST pctxt);
    /*
    * If a member type of a union is a union itself, we need to substitute
    * that member type for its member types.
    * NOTE that this might change in WXS 1.1; i.e. we will keep the union
    * types in WXS 1.1.
    */
    if ((type->memberTypes != NULL) &&
	(xmlSchemaFinishMemberTypeDefinitionsProperty(pctxt, type) == -1))
	return(-1);
    /*
    * SPEC src-simple-type 1
    * "The corresponding simple type definition, if any, must satisfy
    * the conditions set out in Constraints on Simple Type Definition
    * Schema Components ($3.14.6)."
    */
    /*
    * Schema Component Constraint: Simple Type Definition Properties Correct
    * (st-props-correct)
    */
    res = xmlSchemaCheckSTPropsCorrect(pctxt, type);
    HFAILURE HERROR
    /*
    * Schema Component Constraint: Derivation Valid (Restriction, Simple)
    * (cos-st-restricts)
    */
    res = xmlSchemaCheckCOSSTRestricts(pctxt, type);
    HFAILURE HERROR
    /*
    * TODO: Removed the error report, since it got annoying to get an
    * extra error report, if anything failed until now.
    * Enable this if needed.
    *
    * xmlSchemaPErr(ctxt, type->node,
    *    XML_SCHEMAP_SRC_SIMPLE_TYPE_1,
    *    "Simple type '%s' does not satisfy the constraints "
    *    "on simple type definitions.\n",
    *    type->name, NULL);
    */
    /*
    * Schema Component Constraint: Simple Type Restriction (Facets)
    * (st-restrict-facets)
    */
    res = xmlSchemaCheckFacetValues(type, pctxt);
    HFAILURE HERROR
    if ((type->facetSet != NULL) ||
	(type->baseType->facetSet != NULL)) {
	res = xmlSchemaDeriveAndValidateFacets(pctxt, type);
	HFAILURE HERROR
    }
    /*
    * Whitespace value.
    */
    res = xmlSchemaTypeFixupWhitespace(type);
    HFAILURE HERROR
    xmlSchemaTypeFixupOptimFacets(type);

exit_error:
#ifdef DEBUG_TYPE
    xmlSchemaDebugFixedType(pctxt, type);
#endif
    if (olderrs != pctxt->nberrors)
	return(pctxt->err);
    return(0);

exit_failure:
#ifdef DEBUG_TYPE
    xmlSchemaDebugFixedType(pctxt, type);
#endif
    return(-1);
}